

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionUtils.h
# Opt level: O2

void __thiscall ExpressionUtils::~ExpressionUtils(ExpressionUtils *this)

{
  pointer ppEVar1;
  
  for (ppEVar1 = (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar1 !=
      (this->deathMap).super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar1 = ppEVar1 + 1) {
    if (*ppEVar1 != (Expression *)0x0) {
      (*(*ppEVar1)->_vptr_Expression[4])();
    }
  }
  std::_Vector_base<Expression_*,_std::allocator<Expression_*>_>::~_Vector_base
            ((_Vector_base<Expression_*,_std::allocator<Expression_*>_> *)this);
  return;
}

Assistant:

~ExpressionUtils(){
        auto it = this->deathMap.begin();
        while (it != this->deathMap.end()){
            delete *it;
            it++;
        }
    }